

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O3

void __thiscall
HullLibrary::BringOutYourDead
          (HullLibrary *this,cbtVector3 *verts,uint vcount,cbtVector3 *overts,uint *ocount,
          uint *indices,uint indexcount)

{
  uint uVar1;
  uint uVar2;
  int *__s;
  uint *__s_00;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  size_t sVar7;
  cbtAlignedObjectArray<int> tmpIndices;
  TUIntArray usedIndices;
  cbtAlignedObjectArray<int> local_70;
  cbtAlignedObjectArray<unsigned_int> local_50;
  
  local_70.m_ownsMemory = true;
  local_70.m_data = (int *)0x0;
  local_70.m_size = 0;
  local_70.m_capacity = 0;
  uVar1 = *(uint *)(this + 0x24);
  if ((long)(int)uVar1 < 1) {
    local_70.m_capacity = 0;
    local_70.m_size = uVar1;
  }
  else {
    sVar7 = (long)(int)uVar1 << 2;
    __s = (int *)cbtAlignedAllocInternal(sVar7,0x10);
    if ((long)local_70.m_size < 1) {
      if (local_70.m_data != (int *)0x0) goto LAB_008ed5e2;
    }
    else {
      lVar3 = 0;
      do {
        __s[lVar3] = local_70.m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (local_70.m_size != lVar3);
LAB_008ed5e2:
      if (local_70.m_ownsMemory == true) {
        cbtAlignedFreeInternal(local_70.m_data);
      }
    }
    local_70.m_ownsMemory = true;
    local_70.m_data = __s;
    local_70.m_capacity = uVar1;
    memset(__s,0,sVar7);
    local_70.m_size = uVar1;
    if (0 < *(int *)(this + 0x24)) {
      lVar3 = *(long *)(this + 0x30);
      lVar4 = 0;
      do {
        __s[lVar4] = *(int *)(lVar3 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 < *(int *)(this + 0x24));
    }
  }
  local_50.m_ownsMemory = true;
  __s_00 = (uint *)0x0;
  local_50.m_data = (uint *)0x0;
  local_50.m_size = 0;
  local_50.m_capacity = 0;
  sVar7 = (ulong)vcount << 2;
  if ((int)vcount < 1) goto LAB_008ed6bd;
  __s_00 = (uint *)cbtAlignedAllocInternal(sVar7,0x10);
  if ((long)local_50.m_size < 1) {
    if (local_50.m_data != (uint *)0x0) goto LAB_008ed690;
  }
  else {
    lVar3 = 0;
    do {
      __s_00[lVar3] = local_50.m_data[lVar3];
      lVar3 = lVar3 + 1;
    } while (local_50.m_size != lVar3);
LAB_008ed690:
    if (local_50.m_ownsMemory == true) {
      cbtAlignedFreeInternal(local_50.m_data);
    }
  }
  local_50.m_ownsMemory = true;
  local_50.m_capacity = vcount;
  local_50.m_data = __s_00;
  memset(__s_00,0,sVar7);
LAB_008ed6bd:
  local_50.m_size = vcount;
  memset(__s_00,0,sVar7);
  *ocount = 0;
  if (0 < (int)indexcount) {
    uVar5 = 0;
    do {
      uVar1 = indices[uVar5];
      if (__s_00[(int)uVar1] == 0) {
        uVar2 = *ocount;
        indices[uVar5] = uVar2;
        overts[uVar2].m_floats[0] = verts[uVar1].m_floats[0];
        overts[uVar2].m_floats[1] = verts[uVar1].m_floats[1];
        overts[uVar2].m_floats[2] = verts[uVar1].m_floats[2];
        iVar6 = *(int *)(this + 0x24);
        if (0 < iVar6) {
          lVar3 = *(long *)(this + 0x30);
          lVar4 = 0;
          do {
            if (local_70.m_data[lVar4] == uVar1) {
              *(uint *)(lVar3 + lVar4 * 4) = uVar2;
              iVar6 = *(int *)(this + 0x24);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < iVar6);
        }
        *ocount = uVar2 + 1;
        __s_00[(int)uVar1] = uVar2 + 1;
      }
      else {
        indices[uVar5] = __s_00[(int)uVar1] - 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != indexcount);
  }
  cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&local_50);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_70);
  return;
}

Assistant:

void HullLibrary::BringOutYourDead(const cbtVector3 *verts, unsigned int vcount, cbtVector3 *overts, unsigned int &ocount, unsigned int *indices, unsigned indexcount)
{
	cbtAlignedObjectArray<int> tmpIndices;
	tmpIndices.resize(m_vertexIndexMapping.size());
	int i;

	for (i = 0; i < m_vertexIndexMapping.size(); i++)
	{
		tmpIndices[i] = m_vertexIndexMapping[i];
	}

	TUIntArray usedIndices;
	usedIndices.resize(static_cast<int>(vcount));
	memset(&usedIndices[0], 0, sizeof(unsigned int) * vcount);

	ocount = 0;

	for (i = 0; i < int(indexcount); i++)
	{
		unsigned int v = indices[i];  // original array index

		cbtAssert(v >= 0 && v < vcount);

		if (usedIndices[static_cast<int>(v)])  // if already remapped
		{
			indices[i] = usedIndices[static_cast<int>(v)] - 1;  // index to new array
		}
		else
		{
			indices[i] = ocount;  // new index mapping

			overts[ocount][0] = verts[v][0];  // copy old vert to new vert array
			overts[ocount][1] = verts[v][1];
			overts[ocount][2] = verts[v][2];

			for (int k = 0; k < m_vertexIndexMapping.size(); k++)
			{
				if (tmpIndices[k] == int(v))
					m_vertexIndexMapping[k] = ocount;
			}

			ocount++;  // increment output vert count

			cbtAssert(ocount >= 0 && ocount <= vcount);

			usedIndices[static_cast<int>(v)] = ocount;  // assign new index remapping
		}
	}
}